

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macros.cc
# Opt level: O1

bool __thiscall pstack::Dwarf::Macros::visit4(Macros *this,Unit *u,MacroVisitor *visitor)

{
  Reader *this_00;
  LineInfo *pLVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar8;
  undefined4 extraout_var;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long lVar9;
  Off offset;
  long lVar10;
  uchar local_60;
  undefined7 uStack_5f;
  uchar q;
  long local_50 [2];
  MacroVisitor *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_40 = visitor;
  puVar8 = Unit::getLines(u);
  this_00 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  (*this_00->_vptr_Reader[8])(this_00);
  offset = 0;
  bVar5 = false;
  do {
    bVar3 = bVar5;
    if (bVar3) break;
    Reader::readObj<unsigned_char>(this_00,offset,&local_60,1);
    offset = offset + 1;
    bVar5 = bVar3;
    switch(local_60) {
    case '\0':
      bVar5 = true;
      break;
    case '\x01':
      iVar6 = (*this_00->_vptr_Reader[3])(this_00,offset);
      lVar9 = extraout_RDX_02 + offset;
      (*this_00->_vptr_Reader[7])(&local_60,this_00,lVar9);
      lVar10 = _q;
      (*(code *)**(undefined8 **)local_40)(local_40,iVar6,&local_60);
      goto LAB_0014348f;
    case '\x02':
      iVar6 = (*this_00->_vptr_Reader[3])(this_00,offset);
      lVar9 = extraout_RDX + offset;
      (*this_00->_vptr_Reader[7])(&local_60,this_00,lVar9);
      lVar10 = _q;
      (**(code **)(*(long *)local_40 + 8))(local_40,iVar6,&local_60);
LAB_0014348f:
      if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
        operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
      }
      offset = lVar10 + lVar9 + 1;
      break;
    case '\x03':
      iVar6 = (*this_00->_vptr_Reader[3])(this_00,offset);
      iVar7 = (*this_00->_vptr_Reader[3])(this_00,extraout_RDX_00 + offset);
      pLVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
               .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
      cVar4 = (**(code **)(*(long *)local_40 + 0x10))
                        (local_40,iVar6,
                         (ulong)*(uint *)(*(long *)&(pLVar1->files).
                                                                                                        
                                                  super__Vector_base<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>
                                                  ._M_impl + 0x20 +
                                         CONCAT44(extraout_var,iVar7) * 0x30) * 0x20 +
                         *(long *)&(pLVar1->directories).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl);
      offset = extraout_RDX_01 + extraout_RDX_00 + offset;
      if (cVar4 != '\0') break;
LAB_0014344d:
      bVar2 = false;
      goto LAB_001434b7;
    case '\x04':
      cVar4 = (**(code **)(*(long *)local_40 + 0x18))();
      if (cVar4 == '\0') goto LAB_0014344d;
    }
    bVar2 = true;
LAB_001434b7:
  } while (bVar2);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return bVar3;
}

Assistant:

bool
Macros::visit4(Unit &u, MacroVisitor *visitor) const
{
    const auto &lineinfo = u.getLines();
    DWARFReader dr(io);
    for (bool done = false; !done; ) {
        auto code = DWARF_MACINFO_CODE(dr.getu8());
        switch (code) {
            case DW_MACINFO_define: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->define(line, text);
                break;
            }
            case DW_MACINFO_eol: {
                done = true;
                break;
            }
            case DW_MACINFO_undef: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->undef(line, text);
                break;
            }
            case DW_MACINFO_start_file: {
                auto line = dr.getuleb128();
                auto file = dr.getuleb128();
                auto &fileinfo = lineinfo->files[file];
                if (!visitor->startFile(line, lineinfo->directories[fileinfo.dirindex], fileinfo))
                    return false;
                break;
            }
            case DW_MACINFO_end_file: {
                if (!visitor->endFile())
                    return 0;
                break;
            }
            case DW_MACINFO_vendor_ext:
                break;
        }
    }
    return true;
}